

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O0

void cpp_wrapper_all_records
               (planck_unit_test_t *tc,Dictionary<int,_int> *dict,int *expected_records,
               int expected_num_records,ion_boolean_t records_exist)

{
  int32_t iVar1;
  bool bVar2;
  planck_unit_result_t pVar3;
  int iVar4;
  int iVar5;
  Cursor<int,_int> *this;
  int local_40;
  bool local_39;
  int i;
  int iStack_34;
  ion_cursor_status_t status;
  int curr_pos;
  int records_found;
  Cursor<int,_int> *cursor;
  ion_boolean_t records_exist_local;
  int expected_num_records_local;
  int *expected_records_local;
  Dictionary<int,_int> *dict_local;
  planck_unit_test_t *tc_local;
  
  this = Dictionary<int,_int>::allRecords(dict);
  if (records_exist == '\0') {
    bVar2 = Cursor<int,_int>::hasNext(this);
    pVar3 = planck_unit_assert_true
                      (tc,(uint)((bVar2 ^ 0xffU) & 1),0xdd,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar3 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    bVar2 = Cursor<int,_int>::next(this);
    pVar3 = planck_unit_assert_true
                      (tc,(uint)((bVar2 ^ 0xffU) & 1),0xde,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar3 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    if (this != (Cursor<int,_int> *)0x0) {
      Cursor<int,_int>::~Cursor(this);
      operator_delete(this);
    }
  }
  else {
    bVar2 = Cursor<int,_int>::hasNext(this);
    pVar3 = planck_unit_assert_true
                      (tc,(uint)bVar2,0xe5,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was false, expected true");
    if (pVar3 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    iStack_34 = 0;
    i = 0;
    local_39 = Cursor<int,_int>::next(this);
    while (local_39 != false) {
      for (local_40 = 0; local_40 < expected_num_records; local_40 = local_40 + 1) {
        iVar5 = expected_records[local_40];
        iVar4 = Cursor<int,_int>::getKey(this);
        if (iVar5 == iVar4) {
          i = local_40;
          break;
        }
      }
      iVar1 = expected_records[i];
      iVar5 = Cursor<int,_int>::getKey(this);
      pVar3 = planck_unit_assert_int_are_equal
                        (tc,iVar1,iVar5,0xf4,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                        );
      if (pVar3 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      iVar1 = expected_records[i];
      iVar5 = Cursor<int,_int>::getValue(this);
      pVar3 = planck_unit_assert_int_are_equal
                        (tc,iVar1,iVar5,0xf5,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                        );
      if (pVar3 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      expected_records[i] = 999;
      local_39 = Cursor<int,_int>::next(this);
      iStack_34 = iStack_34 + 1;
    }
    bVar2 = Cursor<int,_int>::hasNext(this);
    pVar3 = planck_unit_assert_true
                      (tc,(uint)((bVar2 ^ 0xffU) & 1),0xfc,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar3 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    pVar3 = planck_unit_assert_int_are_equal
                      (tc,expected_num_records,iStack_34,0xff,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                      );
    if (pVar3 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    if (this != (Cursor<int,_int> *)0x0) {
      Cursor<int,_int>::~Cursor(this);
      operator_delete(this);
    }
  }
  return;
}

Assistant:

void
cpp_wrapper_all_records(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int expected_records[],
	int expected_num_records,
	ion_boolean_t records_exist
) {
	Cursor<int, int> *cursor = dict->allRecords();

	if (!records_exist) {
		PLANCK_UNIT_ASSERT_FALSE(tc, cursor->hasNext());
		PLANCK_UNIT_ASSERT_FALSE(tc, cursor->next());

		delete cursor;

		return;
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, cursor->hasNext());

	int records_found			= 0;
	int curr_pos				= 0;

	ion_cursor_status_t status	= cursor->next();

	while (status) {
		for (int i = 0; i < expected_num_records; i++) {
			if (expected_records[i] == cursor->getKey()) {
				curr_pos = i;
				break;
			}
		}

		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_records[curr_pos], cursor->getKey());
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_records[curr_pos], cursor->getValue());

		expected_records[curr_pos]	= NULL_VALUE;
		status						= cursor->next();
		records_found++;
	}

	PLANCK_UNIT_ASSERT_FALSE(tc, cursor->hasNext());

	/* Check that same number of records are found as were inserted with desired key. */
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_num_records, records_found);

	delete cursor;
}